

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void str_utf8_stats(char *str,int max_size,int max_count,int *size,int *count)

{
  int cursor;
  int iVar1;
  
  *size = 0;
  *count = 0;
  cursor = *size;
  while ((((cursor < max_size && (*count < max_count)) &&
          (iVar1 = str_utf8_forward(str,cursor), iVar1 != cursor)) && (iVar1 < max_size))) {
    *size = iVar1;
    *count = *count + 1;
    cursor = *size;
  }
  return;
}

Assistant:

void str_utf8_stats(const char *str, int max_size, int max_count, int *size, int *count)
{
	*size = 0;
	*count = 0;
	while(*size < max_size && *count < max_count)
	{
		int new_size = str_utf8_forward(str, *size);
		if(new_size == *size || new_size >= max_size)
			break;
		*size = new_size;
		++(*count);
	}
}